

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# part_attr.c
# Opt level: O2

exr_result_t exr_attr_set_m33f(exr_context_t ctxt,int part_index,char *name,exr_attr_m33f_t *val)

{
  exr_attr_m33d_t *peVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  exr_result_t eVar5;
  code *UNRECOVERED_JUMPTABLE;
  char *pcVar6;
  char *pcVar7;
  exr_attribute_list_t *list;
  undefined8 uStackY_40;
  exr_attribute_t *attr;
  
  attr = (exr_attribute_t *)0x0;
  if (ctxt == (exr_context_t)0x0) {
    return 2;
  }
  if ((part_index < 0) || (*(int *)(ctxt + 0xc4) <= part_index)) {
    eVar5 = (**(code **)(ctxt + 0x48))
                      (ctxt,4,"Part index (%d) out of range",part_index,*(code **)(ctxt + 0x48));
    return eVar5;
  }
  if (*ctxt == (_priv_exr_context_t)0x3) {
    UNRECOVERED_JUMPTABLE = *(code **)(ctxt + 0x38);
    uStackY_40 = 0x15;
LAB_00115a71:
    eVar5 = (*UNRECOVERED_JUMPTABLE)(ctxt,uStackY_40);
    return eVar5;
  }
  if (*ctxt == (_priv_exr_context_t)0x0) {
    UNRECOVERED_JUMPTABLE = *(code **)(ctxt + 0x38);
    uStackY_40 = 8;
    goto LAB_00115a71;
  }
  list = (exr_attribute_list_t *)
         (*(long *)(*(long *)(ctxt + 0x1d8) + (ulong)(uint)part_index * 8) + 8);
  eVar5 = exr_attr_list_find_by_name(ctxt,list,name,&attr);
  if (eVar5 == 0) {
    if (attr->type != EXR_ATTR_M33F) {
      pcVar7 = attr->type_name;
      pcVar6 = "\'%s\' requested type \'m33f\', but stored attributes is type \'%s\'";
      uStackY_40 = 0x10;
      goto LAB_00115b3c;
    }
    if (val != (exr_attr_m33f_t *)0x0) goto LAB_00115af4;
  }
  else {
    if (eVar5 != 0xf) {
      return eVar5;
    }
    if (*ctxt != (_priv_exr_context_t)0x1) {
      return 0xf;
    }
    eVar5 = exr_attr_list_add(ctxt,list,name,EXR_ATTR_M33F,0,(uint8_t **)0x0,&attr);
    if (val != (exr_attr_m33f_t *)0x0) {
      if (eVar5 != 0) {
        return eVar5;
      }
LAB_00115af4:
      peVar1 = (attr->field_6).m33d;
      *(float *)(peVar1->m + 4) = val->m[8];
      dVar2 = *(double *)val->m;
      dVar3 = *(double *)(val->m + 2);
      dVar4 = *(double *)(val->m + 6);
      peVar1->m[2] = *(double *)(val->m + 4);
      peVar1->m[3] = dVar4;
      peVar1->m[0] = dVar2;
      peVar1->m[1] = dVar3;
      return 0;
    }
  }
  pcVar6 = "No input value for setting \'%s\', type \'%s\'";
  pcVar7 = "m33f";
  uStackY_40 = 3;
LAB_00115b3c:
  eVar5 = (**(code **)(ctxt + 0x48))(ctxt,uStackY_40,pcVar6,name,pcVar7);
  return eVar5;
}

Assistant:

exr_result_t
exr_attr_set_m33f (
    exr_context_t          ctxt,
    int                    part_index,
    const char*            name,
    const exr_attr_m33f_t* val)
{
    ATTR_SET_IMPL_DEREF (EXR_ATTR_M33F, m33f);
}